

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void secp256k1_ellswift_prng(uchar *out32,secp256k1_sha256 *hasher,uint32_t cnt)

{
  uint uVar1;
  int iVar2;
  secp256k1_gej *psVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  secp256k1_scalar *a;
  int iVar9;
  secp256k1_fe *psVar10;
  secp256k1_sha256 *psVar11;
  secp256k1_sha256 *psVar12;
  secp256k1_gej *psVar13;
  uint uVar14;
  code *unaff_RBP;
  secp256k1_sha256 *psVar15;
  secp256k1_sha256 *a_00;
  secp256k1_ge *psVar16;
  secp256k1_fe *a_01;
  secp256k1_fe *psVar17;
  secp256k1_fe *psVar18;
  secp256k1_gej *r;
  secp256k1_ge *a_02;
  secp256k1_ge *psVar19;
  ulong uVar20;
  uint64_t *puVar21;
  uint64_t *puVar22;
  secp256k1_gej *psVar23;
  secp256k1_sha256 *psVar24;
  int iVar25;
  secp256k1_gej *psVar26;
  secp256k1_sha256 *psVar27;
  secp256k1_gej *unaff_R13;
  secp256k1_gej *psVar28;
  secp256k1_gej *psVar29;
  secp256k1_sha256 *hash_00;
  ulong uVar30;
  secp256k1_gej *psVar31;
  secp256k1_gej *psVar32;
  bool bVar33;
  uchar buf4 [4];
  secp256k1_sha256 hash;
  ulong uStack_1118;
  undefined1 auStack_1108 [32];
  undefined1 auStack_10e8 [88];
  uint64_t uStack_1090;
  uint64_t uStack_1088;
  uint64_t uStack_1080;
  uint64_t uStack_1078;
  int iStack_1070;
  int iStack_106c;
  secp256k1_fe sStack_1068;
  undefined4 uStack_1038;
  secp256k1_fe sStack_1028;
  secp256k1_scalar sStack_ff8;
  secp256k1_ge sStack_fd8;
  secp256k1_fe asStack_f40 [31];
  secp256k1_ge sStack_958;
  secp256k1_fe asStack_8c0 [31];
  secp256k1_sha256 *psStack_2d0;
  secp256k1_sha256 *psStack_2c8;
  secp256k1_gej *psStack_2c0;
  secp256k1_sha256 *psStack_2b8;
  secp256k1_gej *psStack_2b0;
  code *pcStack_2a8;
  undefined1 auStack_2a0 [128];
  secp256k1_gej *psStack_220;
  secp256k1_sha256 *psStack_218;
  secp256k1_gej *psStack_210;
  secp256k1_sha256 *psStack_208;
  secp256k1_sha256 *psStack_200;
  undefined1 auStack_1d8 [56];
  ulong uStack_1a0;
  ulong uStack_198;
  uint64_t uStack_190;
  uint64_t uStack_188;
  int iStack_180;
  int iStack_17c;
  secp256k1_modinv64_signed62 sStack_178;
  secp256k1_fe sStack_150;
  secp256k1_fe *psStack_120;
  secp256k1_sha256 *psStack_118;
  undefined1 auStack_110 [56];
  long lStack_d8;
  long lStack_d0;
  long lStack_c8;
  long lStack_c0;
  int iStack_b8;
  uchar auStack_b4 [12];
  uchar *puStack_a8;
  uint32_t local_84;
  secp256k1_sha256 local_80;
  
  bVar5 = 0;
  hash_00 = &local_80;
  psVar27 = hash_00;
  for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(undefined8 *)psVar27->s = *(undefined8 *)hasher->s;
    hasher = (secp256k1_sha256 *)(hasher->s + 2);
    psVar27 = (secp256k1_sha256 *)(psVar27->s + 2);
  }
  uVar30 = local_80.bytes >> 6;
  local_84 = cnt;
  secp256k1_sha256_write(hash_00,(uchar *)&local_84,4);
  psVar10 = (secp256k1_fe *)out32;
  secp256k1_sha256_finalize(hash_00,out32);
  if (local_80.bytes >> 6 == uVar30 + 1) {
    return;
  }
  secp256k1_ellswift_prng_cold_1();
  psVar11 = (secp256k1_sha256 *)auStack_110;
  psVar17 = (secp256k1_fe *)auStack_110;
  psVar18 = (secp256k1_fe *)auStack_110;
  psVar31 = (secp256k1_gej *)0xfffffffffffff;
  psVar27 = (secp256k1_sha256 *)0x1000003d0;
  psStack_118 = (secp256k1_sha256 *)0x14866f;
  puStack_a8 = out32;
  secp256k1_fe_verify(psVar10);
  uVar30 = (psVar10->n[4] >> 0x30) * 0x1000003d1 + psVar10->n[0];
  if (((uVar30 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar30 & 0xfffffffffffff) == 0)) {
    uVar8 = (uVar30 >> 0x34) + psVar10->n[1];
    psVar15 = (secp256k1_sha256 *)((uVar8 >> 0x34) + psVar10->n[2]);
    a_01 = (secp256k1_fe *)(((ulong)psVar15 >> 0x34) + psVar10->n[3]);
    uVar20 = ((ulong)a_01 >> 0x34) + (psVar10->n[4] & 0xffffffffffff);
    if ((((uVar8 | uVar30 | (ulong)psVar15 | (ulong)a_01) & 0xfffffffffffff) != 0 || uVar20 != 0) &&
       (((uVar30 | 0x1000003d0) & uVar8 & (ulong)psVar15 & (ulong)a_01 & (uVar20 ^ 0xf000000000000))
        != 0xfffffffffffff)) goto LAB_00148715;
    psStack_118 = (secp256k1_sha256 *)0x148862;
    secp256k1_ge_x_frac_on_curve_var_cold_1();
  }
  else {
LAB_00148715:
    psVar31 = (secp256k1_gej *)(auStack_110 + 0x30);
    psStack_118 = (secp256k1_sha256 *)0x148728;
    secp256k1_fe_mul((secp256k1_fe *)psVar31,psVar10,(secp256k1_fe *)hash_00);
    psStack_118 = (secp256k1_sha256 *)0x148736;
    secp256k1_fe_sqr((secp256k1_fe *)auStack_110,(secp256k1_fe *)hash_00);
    psStack_118 = (secp256k1_sha256 *)0x148744;
    secp256k1_fe_mul((secp256k1_fe *)psVar31,(secp256k1_fe *)psVar31,(secp256k1_fe *)auStack_110);
    psStack_118 = (secp256k1_sha256 *)0x14874f;
    secp256k1_fe_sqr((secp256k1_fe *)auStack_110,psVar10);
    psStack_118 = (secp256k1_sha256 *)0x14875a;
    secp256k1_fe_sqr((secp256k1_fe *)auStack_110,(secp256k1_fe *)auStack_110);
    psStack_118 = (secp256k1_sha256 *)0x148762;
    secp256k1_fe_verify((secp256k1_fe *)auStack_110);
    psVar15 = psVar11;
    a_01 = psVar17;
    psVar27 = (secp256k1_sha256 *)auStack_110;
    if ((int)auStack_110._40_4_ < 5) {
      auStack_110._40_4_ = auStack_110._40_4_ * 7;
      psVar15 = (secp256k1_sha256 *)(auStack_110._0_8_ * 7);
      auStack_110._8_8_ = auStack_110._8_8_ * 7;
      auStack_110._16_8_ = auStack_110._16_8_ * 7;
      auStack_110._24_8_ = auStack_110._24_8_ * 7;
      auStack_110._32_8_ = auStack_110._32_8_ * 7;
      auStack_110._44_4_ = 0;
      psStack_118 = (secp256k1_sha256 *)0x1487eb;
      auStack_110._0_8_ = psVar15;
      secp256k1_fe_verify((secp256k1_fe *)auStack_110);
      hash_00 = (secp256k1_sha256 *)(auStack_110 + 0x30);
      psStack_118 = (secp256k1_sha256 *)0x1487f8;
      secp256k1_fe_verify((secp256k1_fe *)hash_00);
      psStack_118 = (secp256k1_sha256 *)0x148800;
      secp256k1_fe_verify((secp256k1_fe *)auStack_110);
      iStack_b8 = auStack_110._40_4_ + iStack_b8;
      psVar10 = (secp256k1_fe *)auStack_110;
      a_01 = psVar18;
      psVar27 = (secp256k1_sha256 *)auStack_110;
      if (iStack_b8 < 0x21) {
        auStack_110._48_8_ = (long)(uint32_t *)auStack_110._0_8_ + auStack_110._48_8_;
        lStack_d8 = lStack_d8 + auStack_110._8_8_;
        lStack_d0 = lStack_d0 + auStack_110._16_8_;
        lStack_c8 = lStack_c8 + auStack_110._24_8_;
        lStack_c0 = lStack_c0 + auStack_110._32_8_;
        auStack_b4[0] = '\0';
        auStack_b4[1] = '\0';
        auStack_b4[2] = '\0';
        auStack_b4[3] = '\0';
        psStack_118 = (secp256k1_sha256 *)0x148849;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_110 + 0x30));
        psStack_118 = (secp256k1_sha256 *)0x148851;
        secp256k1_fe_is_square_var((secp256k1_fe *)(auStack_110 + 0x30));
        return;
      }
      goto LAB_00148867;
    }
  }
  psStack_118 = (secp256k1_sha256 *)0x148867;
  secp256k1_ge_x_frac_on_curve_var_cold_3();
LAB_00148867:
  psStack_118 = (secp256k1_sha256 *)secp256k1_fe_is_square_var;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psStack_118 = hash_00;
  psStack_120 = psVar10;
  r = (secp256k1_gej *)auStack_1d8;
  psVar32 = (secp256k1_gej *)auStack_1d8;
  psVar11 = (secp256k1_sha256 *)auStack_1d8;
  auStack_1d8._48_8_ = a_01->n[0];
  uStack_1a0 = a_01->n[1];
  uStack_198 = a_01->n[2];
  uStack_190 = a_01->n[3];
  uStack_188 = a_01->n[4];
  iStack_180 = a_01->magnitude;
  iStack_17c = a_01->normalized;
  secp256k1_fe_verify(a_01);
  auStack_1d8._0_8_ = a_01->n[0];
  auStack_1d8._8_8_ = a_01->n[1];
  auStack_1d8._16_8_ = a_01->n[2];
  auStack_1d8._24_8_ = a_01->n[3];
  auStack_1d8._32_8_ = a_01->n[4];
  auStack_1d8._40_8_ = *(undefined8 *)&a_01->magnitude;
  secp256k1_fe_normalize_var((secp256k1_fe *)auStack_1d8);
  secp256k1_fe_verify((secp256k1_fe *)auStack_1d8);
  if (auStack_1d8._44_4_ == 0) {
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((auStack_1d8._16_8_ == 0 && auStack_1d8._24_8_ == 0) &&
        (auStack_1d8._8_8_ == 0 && auStack_1d8._0_8_ == 0)) && auStack_1d8._32_8_ == 0) {
      psVar11 = (secp256k1_sha256 *)0x1;
    }
    else {
      sStack_178.v[0] = (auStack_1d8._8_8_ << 0x34 | auStack_1d8._0_8_) & 0x3fffffffffffffff;
      sStack_178.v[1] =
           (ulong)((uint)auStack_1d8._16_8_ & 0xfffff) << 0x2a | (ulong)auStack_1d8._8_8_ >> 10;
      sStack_178.v[2] =
           (ulong)((uint)auStack_1d8._24_8_ & 0x3fffffff) << 0x20 |
           (ulong)auStack_1d8._16_8_ >> 0x14;
      sStack_178.v[3] =
           (auStack_1d8._32_8_ & 0xffffffffff) << 0x16 | (ulong)auStack_1d8._24_8_ >> 0x1e;
      sStack_178.v[4] = (ulong)auStack_1d8._32_8_ >> 0x28;
      uVar1 = secp256k1_jacobi64_maybe_var(&sStack_178,&secp256k1_const_modinfo_fe);
      if (uVar1 == 0) {
        uVar1 = secp256k1_fe_sqrt(&sStack_150,(secp256k1_fe *)auStack_1d8);
        psVar11 = (secp256k1_sha256 *)(ulong)uVar1;
      }
      else {
        psVar11 = (secp256k1_sha256 *)(ulong)(~uVar1 >> 0x1f);
      }
    }
    hash_00 = (secp256k1_sha256 *)(auStack_1d8 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)hash_00);
    auStack_1d8._48_8_ = (uStack_188 >> 0x30) * 0x1000003d1 + auStack_1d8._48_8_;
    uStack_1a0 = ((ulong)auStack_1d8._48_8_ >> 0x34) + uStack_1a0;
    uStack_198 = (uStack_1a0 >> 0x34) + uStack_198;
    uVar30 = (uStack_198 >> 0x34) + uStack_190;
    uStack_190 = uVar30 & 0xfffffffffffff;
    uStack_188 = (uVar30 >> 0x34) + (uStack_188 & 0xffffffffffff);
    uStack_198 = uStack_198 & 0xfffffffffffff;
    uStack_1a0 = uStack_1a0 & 0xfffffffffffff;
    auStack_1d8._48_8_ = auStack_1d8._48_8_ & 0xfffffffffffff;
    iStack_180 = 1;
    secp256k1_fe_verify((secp256k1_fe *)hash_00);
    psVar15 = hash_00;
    iVar2 = secp256k1_fe_sqrt((secp256k1_fe *)auStack_1d8,(secp256k1_fe *)hash_00);
    r = psVar32;
    if ((int)psVar11 == iVar2) {
      return;
    }
  }
  secp256k1_fe_is_square_var_cold_1();
  psStack_200 = psVar27;
  psStack_208 = psVar11;
  psVar28 = (secp256k1_gej *)auStack_2a0;
  psVar29 = (secp256k1_gej *)auStack_2a0;
  auStack_2a0._80_8_ = *(uint64_t *)psVar15->buf;
  psVar32 = *(secp256k1_gej **)psVar15->s;
  auStack_2a0._64_8_ = *(uint64_t *)(psVar15->s + 4);
  auStack_2a0._72_8_ = *(uint64_t *)(psVar15->s + 6);
  auStack_2a0._48_8_ = psVar32;
  auStack_2a0._56_8_ = *(uint64_t *)(psVar15->s + 2);
  auStack_2a0._0_8_ = (r->x).n[0];
  auStack_2a0._8_8_ = (r->x).n[1];
  auStack_2a0._16_8_ = (r->x).n[2];
  auStack_2a0._24_8_ = (r->x).n[3];
  auStack_2a0._32_8_ = (r->x).n[4];
  a_00 = psVar15;
  if (((((long)auStack_2a0._0_8_ < 0) || ((long)auStack_2a0._8_8_ < 0)) ||
      (psVar11 = psVar15, a_00 = (secp256k1_sha256 *)auStack_2a0._16_8_,
      (long)auStack_2a0._16_8_ < 0)) ||
     ((r = (secp256k1_gej *)auStack_2a0._24_8_, (long)auStack_2a0._24_8_ < 0 ||
      ((long)auStack_2a0._32_8_ < 0)))) {
LAB_00148ef3:
    pcStack_2a8 = (code *)0x148ef8;
    secp256k1_jacobi64_maybe_var_cold_18();
  }
  else {
    a_00 = (secp256k1_sha256 *)
           (auStack_2a0._16_8_ | auStack_2a0._24_8_ | auStack_2a0._8_8_ | auStack_2a0._0_8_ |
           auStack_2a0._32_8_);
    if (a_00 != (secp256k1_sha256 *)0x0) {
      hash_00 = (secp256k1_sha256 *)0x5;
      unaff_RBP = (code *)0xffffffffffffffff;
      auStack_2a0._104_8_ = 0;
      psVar12 = (secp256k1_sha256 *)0x0;
      auStack_2a0._96_8_ = psVar15;
      do {
        psVar11 = (secp256k1_sha256 *)auStack_2a0._96_8_;
        r = (secp256k1_gej *)(auStack_2a0._56_8_ << 0x3e | (ulong)psVar32);
        puVar21 = (uint64_t *)(auStack_2a0._8_8_ << 0x3e | auStack_2a0._0_8_);
        psVar31 = (secp256k1_gej *)0x0;
        psVar24 = (secp256k1_sha256 *)0x0;
        psVar32 = (secp256k1_gej *)0x1;
        iVar2 = 0x3e;
        psVar15 = (secp256k1_sha256 *)0x1;
        puVar22 = puVar21;
        psVar26 = r;
        while( true ) {
          uVar30 = -1L << ((byte)iVar2 & 0x3f) | (ulong)puVar22;
          lVar7 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          bVar4 = (byte)lVar7;
          psVar23 = (secp256k1_gej *)((ulong)puVar22 >> (bVar4 & 0x3f));
          psVar15 = (secp256k1_sha256 *)((long)psVar15 << (bVar4 & 0x3f));
          psVar31 = (secp256k1_gej *)((long)psVar31 << (bVar4 & 0x3f));
          unaff_RBP = unaff_RBP + -lVar7;
          a_00 = (secp256k1_sha256 *)((ulong)psVar26 >> 2);
          uVar1 = ((uint)((ulong)psVar26 >> 1) ^ (uint)a_00) & (uint)lVar7 ^ (uint)psVar12;
          psVar27 = (secp256k1_sha256 *)(ulong)uVar1;
          iVar2 = iVar2 - (uint)lVar7;
          auStack_2a0._112_8_ = hash_00;
          if (iVar2 == 0) break;
          if (((ulong)psVar26 & 1) == 0) {
            pcStack_2a8 = (code *)0x148ea8;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_00148ea8:
            pcStack_2a8 = (code *)0x148ead;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_00148ead:
            pcStack_2a8 = (code *)0x148eb2;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_00148eb2:
            pcStack_2a8 = (code *)0x148eb7;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_00148eb7;
          }
          if (((ulong)psVar23 & 1) == 0) goto LAB_00148ea8;
          a_00 = (secp256k1_sha256 *)((long)psVar31 * (long)puVar21 + (long)psVar15 * (long)r);
          bVar4 = 0x3e - (char)iVar2;
          psVar12 = (secp256k1_sha256 *)((long)psVar26 << (bVar4 & 0x3f));
          if (a_00 != psVar12) goto LAB_00148ead;
          psVar12 = (secp256k1_sha256 *)((long)psVar32 * (long)puVar21 + (long)psVar24 * (long)r);
          a_00 = (secp256k1_sha256 *)((long)psVar23 << (bVar4 & 0x3f));
          if (psVar12 != a_00) goto LAB_00148eb2;
          iVar25 = (int)psVar26;
          iVar9 = (int)psVar23;
          if ((long)unaff_RBP < 0) {
            unaff_RBP = (code *)-(long)unaff_RBP;
            iVar6 = (int)unaff_RBP + 1;
            if (iVar2 <= iVar6) {
              iVar6 = iVar2;
            }
            a_00 = (secp256k1_sha256 *)(ulong)(iVar6 - 0x3fU);
            if (0xffffffc1 < iVar6 - 0x3fU) {
              psVar12 = (secp256k1_sha256 *)
                        (ulong)(uVar1 ^ (uint)(((ulong)psVar23 & (ulong)psVar26) >> 1));
              uVar30 = (ulong)(0x3fL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU);
              uVar1 = (iVar9 * iVar9 + 0x3e) * iVar9 * iVar25 & (uint)uVar30;
              psVar3 = psVar31;
              psVar31 = psVar32;
              psVar13 = psVar23;
              a_00 = psVar15;
              psVar15 = psVar24;
              goto LAB_00148ca0;
            }
            goto LAB_00148ec1;
          }
          iVar6 = (int)unaff_RBP + 1;
          if (iVar2 <= iVar6) {
            iVar6 = iVar2;
          }
          a_00 = (secp256k1_sha256 *)(ulong)(iVar6 - 0x3fU);
          if (iVar6 - 0x3fU < 0xffffffc2) goto LAB_00148ebc;
          uVar30 = (ulong)(0xfL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU);
          uVar1 = -(iVar9 * ((iVar25 * 2 + 2U & 8) + iVar25)) & (uint)uVar30;
          psVar3 = psVar32;
          psVar13 = psVar26;
          a_00 = psVar24;
          psVar26 = psVar23;
          psVar12 = psVar27;
LAB_00148ca0:
          uVar8 = (ulong)uVar1;
          puVar22 = (uint64_t *)((long)(psVar26->x).n + uVar8 * (long)psVar13);
          psVar24 = (secp256k1_sha256 *)((long)a_00->s + (long)psVar15 * uVar8);
          psVar32 = (secp256k1_gej *)((long)(psVar3->x).n + uVar8 * (long)psVar31);
          psVar26 = psVar13;
          psVar27 = psVar12;
          if (((ulong)puVar22 & uVar30) != 0) {
LAB_00148eb7:
            pcStack_2a8 = (code *)0x148ebc;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00148ebc:
            pcStack_2a8 = (code *)0x148ec1;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_00148ec1:
            pcStack_2a8 = (code *)0x148ec6;
            secp256k1_jacobi64_maybe_var_cold_5();
            goto LAB_00148ec6;
          }
        }
        r = (secp256k1_gej *)((long)psVar31 * (long)psVar24);
        lVar7 = (long)psVar15 * (long)psVar32 - (long)r;
        uVar30 = (ulong)((secp256k1_gej *)((long)psVar15 * (long)psVar32) < r);
        uVar8 = SUB168(SEXT816((long)psVar15) * SEXT816((long)psVar32),8) -
                SUB168(SEXT816((long)psVar31) * SEXT816((long)psVar24),8);
        auStack_2a0._120_8_ = psVar15;
        psStack_220 = psVar31;
        psStack_218 = psVar24;
        psStack_210 = psVar32;
        if ((lVar7 != 0x4000000000000000 || uVar8 != uVar30) &&
           (uVar8 - uVar30 != -1 || lVar7 != -0x4000000000000000)) {
LAB_00148ec6:
          pcStack_2a8 = (code *)0x148ecb;
          secp256k1_jacobi64_maybe_var_cold_16();
          psVar11 = psVar12;
          hash_00 = psVar15;
LAB_00148ecb:
          pcStack_2a8 = (code *)0x148ed0;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_00148ed0:
          pcStack_2a8 = (code *)0x148ed5;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_00148ed5:
          pcStack_2a8 = (code *)0x148eda;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00148eda:
          pcStack_2a8 = (code *)0x148edf;
          secp256k1_jacobi64_maybe_var_cold_12();
          psVar31 = (secp256k1_gej *)auStack_2a0;
LAB_00148edf:
          pcStack_2a8 = (code *)0x148ee4;
          secp256k1_jacobi64_maybe_var_cold_11();
LAB_00148ee4:
          psVar28 = psVar31;
          pcStack_2a8 = (code *)0x148ee9;
          secp256k1_jacobi64_maybe_var_cold_10();
LAB_00148ee9:
          pcStack_2a8 = (code *)0x148eee;
          secp256k1_jacobi64_maybe_var_cold_9();
          psVar29 = psVar28;
LAB_00148eee:
          pcStack_2a8 = (code *)0x148ef3;
          secp256k1_jacobi64_maybe_var_cold_8();
          unaff_R13 = psVar29;
          psVar31 = psVar32;
          goto LAB_00148ef3;
        }
        psVar32 = (secp256k1_gej *)(auStack_2a0 + 0x30);
        iVar9 = (int)hash_00;
        pcStack_2a8 = (code *)0x148d49;
        a_00 = hash_00;
        r = psVar32;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar32,iVar9,
                           (secp256k1_modinv64_signed62 *)auStack_2a0._96_8_,0);
        if (iVar2 < 1) goto LAB_00148ecb;
        pcStack_2a8 = (code *)0x148d64;
        a_00 = hash_00;
        r = psVar32;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar32,iVar9,
                           (secp256k1_modinv64_signed62 *)psVar11,1);
        if (0 < iVar2) goto LAB_00148ed0;
        pcStack_2a8 = (code *)0x148d7c;
        a_00 = hash_00;
        r = (secp256k1_gej *)auStack_2a0;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_2a0,iVar9,
                           (secp256k1_modinv64_signed62 *)psVar11,0);
        if (iVar2 < 1) goto LAB_00148ed5;
        pcStack_2a8 = (code *)0x148d97;
        a_00 = hash_00;
        r = (secp256k1_gej *)auStack_2a0;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_2a0,iVar9,
                           (secp256k1_modinv64_signed62 *)psVar11,1);
        if (-1 < iVar2) goto LAB_00148eda;
        pcStack_2a8 = (code *)0x148db2;
        secp256k1_modinv64_update_fg_62_var
                  (iVar9,(secp256k1_modinv64_signed62 *)psVar32,
                   (secp256k1_modinv64_signed62 *)auStack_2a0,
                   (secp256k1_modinv64_trans2x2 *)(auStack_2a0 + 0x78));
        psVar32 = (secp256k1_gej *)auStack_2a0._48_8_;
        if ((secp256k1_gej *)auStack_2a0._48_8_ == (secp256k1_gej *)0x1) {
          if (iVar9 < 2) {
            return;
          }
          psVar15 = (secp256k1_sha256 *)0x1;
          uVar30 = 0;
          do {
            uVar30 = uVar30 | *(ulong *)(auStack_2a0 + (long)psVar15 * 8 + 0x30);
            psVar15 = (secp256k1_sha256 *)((long)psVar15->s + 1);
          } while (hash_00 != psVar15);
          if (uVar30 == 0) {
            return;
          }
        }
        lVar7 = (long)iVar9;
        if ((-1 < lVar7 + -2 && *(long *)(auStack_2a0 + lVar7 * 8 + 0x28) == 0) &&
            (&pcStack_2a8)[lVar7] == (code *)0x0) {
          hash_00 = (secp256k1_sha256 *)(ulong)(iVar9 - 1);
        }
        psVar31 = (secp256k1_gej *)(auStack_2a0 + 0x30);
        pcStack_2a8 = (code *)0x148e19;
        iVar9 = (int)hash_00;
        a_00 = hash_00;
        r = psVar31;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar31,iVar9,
                           (secp256k1_modinv64_signed62 *)psVar11,0);
        if (iVar2 < 1) goto LAB_00148edf;
        pcStack_2a8 = (code *)0x148e34;
        a_00 = hash_00;
        r = psVar31;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar31,iVar9,
                           (secp256k1_modinv64_signed62 *)psVar11,1);
        if (0 < iVar2) goto LAB_00148ee4;
        pcStack_2a8 = (code *)0x148e4f;
        a_00 = hash_00;
        r = (secp256k1_gej *)auStack_2a0;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_2a0,iVar9,
                           (secp256k1_modinv64_signed62 *)psVar11,0);
        if (iVar2 < 1) goto LAB_00148ee9;
        pcStack_2a8 = (code *)0x148e6a;
        a_00 = hash_00;
        r = (secp256k1_gej *)auStack_2a0;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_2a0,iVar9,
                           (secp256k1_modinv64_signed62 *)psVar11,1);
        if (-1 < iVar2) goto LAB_00148eee;
        uVar1 = (int)auStack_2a0._104_8_ + 1;
        auStack_2a0._104_8_ = ZEXT48(uVar1);
        psVar12 = psVar27;
        if (uVar1 == 0xc) {
          return;
        }
      } while( true );
    }
  }
  pcStack_2a8 = secp256k1_ecmult_const;
  secp256k1_jacobi64_maybe_var_cold_17();
  psStack_2d0 = psVar11;
  psStack_2c8 = psVar27;
  psStack_2c0 = unaff_R13;
  psStack_2b8 = hash_00;
  psStack_2b0 = psVar31;
  pcStack_2a8 = unaff_RBP;
  secp256k1_ge_verify((secp256k1_ge *)a_00);
  if ((int)a_00->bytes != 0) {
    secp256k1_gej_set_infinity(r);
    return;
  }
  secp256k1_scalar_add(&sStack_ff8,a,&secp256k1_ecmult_const_K);
  secp256k1_scalar_half(&sStack_ff8,&sStack_ff8);
  secp256k1_scalar_split_lambda
            ((secp256k1_scalar *)auStack_1108,(secp256k1_scalar *)auStack_10e8,&sStack_ff8);
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_1108,(secp256k1_scalar *)auStack_1108,
             &secp256k1_ecmult_const::S_OFFSET);
  psVar16 = (secp256k1_ge *)auStack_10e8;
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_10e8,(secp256k1_scalar *)auStack_10e8,
             &secp256k1_ecmult_const::S_OFFSET);
  uVar30 = 0x81;
  while( true ) {
    a_02 = (secp256k1_ge *)auStack_1108;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1108);
    if ((*(ulong *)(auStack_1108 + (uVar30 >> 6) * 8) >> (uVar30 & 0x3f) & 1) != 0) break;
    a_02 = (secp256k1_ge *)auStack_10e8;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_10e8);
    if ((*(ulong *)(auStack_10e8 + (uVar30 >> 6) * 8) & 1L << ((byte)uVar30 & 0x3f)) != 0)
    goto LAB_0014944b;
    uVar1 = (int)uVar30 + 1;
    uVar30 = (ulong)uVar1;
    if (uVar1 == 0x100) {
      secp256k1_gej_set_ge(r,(secp256k1_ge *)a_00);
      secp256k1_ecmult_odd_multiples_table(0x10,&sStack_958,&sStack_fd8.x,&sStack_1028,r);
      secp256k1_ge_table_set_globalz(0x10,&sStack_958,&sStack_fd8.x);
      lVar7 = 0;
      do {
        secp256k1_ge_mul_lambda
                  ((secp256k1_ge *)((long)sStack_fd8.x.n + lVar7),
                   (secp256k1_ge *)((long)sStack_958.x.n + lVar7));
        lVar7 = lVar7 + 0x68;
      } while (lVar7 != 0x680);
      iVar2 = 0x19;
      psVar16 = (secp256k1_ge *)(auStack_10e8 + 0x50);
      do {
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_1108);
        uVar1 = iVar2 * 5 + 4U >> 6;
        uVar14 = (uint)(iVar2 * 5) >> 6;
        bVar5 = (byte)(iVar2 * 5) & 0x3f;
        if (uVar1 == uVar14) {
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1108);
          uVar1 = uVar1 << 3;
          uVar8 = *(ulong *)(auStack_1108 + uVar1) >> bVar5;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_10e8);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_10e8);
          uStack_1118 = *(ulong *)(auStack_10e8 + uVar1) >> bVar5;
        }
        else {
          uVar30 = (ulong)(uVar14 << 3);
          uVar8 = *(ulong *)(auStack_1108 + uVar30) >> bVar5 |
                  *(long *)(auStack_1108 + uVar30 + 8) << 0x40 - bVar5;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_10e8);
          uStack_1118 = *(ulong *)(auStack_10e8 + uVar30) >> bVar5 |
                        *(long *)(auStack_10e8 + uVar30 + 8) << 0x40 - bVar5;
        }
        uVar1 = (uint)((uVar8 & 0x10) == 0);
        uStack_1078 = sStack_958.x.n[4];
        iStack_1070 = sStack_958.x.magnitude;
        iStack_106c = sStack_958.x.normalized;
        uStack_1088 = sStack_958.x.n[2];
        uStack_1080 = sStack_958.x.n[3];
        auStack_10e8._80_8_ = sStack_958.x.n[0];
        uStack_1090 = sStack_958.x.n[1];
        sStack_1068.n[0] = sStack_958.y.n[0];
        sStack_1068.n[1] = sStack_958.y.n[1];
        sStack_1068.n[4] = sStack_958.y.n[4];
        sStack_1068.magnitude = sStack_958.y.magnitude;
        sStack_1068.normalized = sStack_958.y.normalized;
        sStack_1068.n[2] = sStack_958.y.n[2];
        sStack_1068.n[3] = sStack_958.y.n[3];
        uVar30 = 1;
        psVar10 = asStack_8c0;
        do {
          uVar14 = (uint)(((-uVar1 ^ (uint)uVar8) & 0xf) == uVar30);
          secp256k1_fe_cmov((secp256k1_fe *)psVar16,psVar10 + -1,uVar14);
          secp256k1_fe_cmov(&sStack_1068,psVar10,uVar14);
          uVar30 = uVar30 + 1;
          psVar10 = (secp256k1_fe *)(psVar10[2].n + 1);
        } while (uVar30 != 0x10);
        uStack_1038 = 0;
        secp256k1_fe_verify(&sStack_1068);
        secp256k1_fe_verify_magnitude(&sStack_1068,1);
        auStack_10e8._32_8_ = 0x3ffffbfffff0bc - sStack_1068.n[0];
        auStack_10e8._40_8_ = 0x3ffffffffffffc - sStack_1068.n[1];
        auStack_10e8._48_8_ = 0x3ffffffffffffc - sStack_1068.n[2];
        auStack_10e8._56_8_ = 0x3ffffffffffffc - sStack_1068.n[3];
        auStack_10e8._64_8_ = 0x3fffffffffffc - sStack_1068.n[4];
        auStack_10e8._72_8_ = 2;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_10e8 + 0x20));
        secp256k1_fe_cmov(&sStack_1068,(secp256k1_fe *)(auStack_10e8 + 0x20),uVar1);
        if (iVar2 == 0x19) {
          secp256k1_gej_set_ge(r,psVar16);
        }
        else {
          iVar9 = 5;
          do {
            secp256k1_gej_double(r,r);
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
          secp256k1_gej_add_ge(r,r,psVar16);
        }
        uVar1 = (uint)((uStack_1118 & 0x10) == 0);
        uStack_1078 = sStack_fd8.x.n[4];
        iStack_1070 = sStack_fd8.x.magnitude;
        iStack_106c = sStack_fd8.x.normalized;
        uStack_1088 = sStack_fd8.x.n[2];
        uStack_1080 = sStack_fd8.x.n[3];
        auStack_10e8._80_8_ = sStack_fd8.x.n[0];
        uStack_1090 = sStack_fd8.x.n[1];
        sStack_1068.n[0] = sStack_fd8.y.n[0];
        sStack_1068.n[1] = sStack_fd8.y.n[1];
        sStack_1068.n[4] = sStack_fd8.y.n[4];
        sStack_1068.magnitude = sStack_fd8.y.magnitude;
        sStack_1068.normalized = sStack_fd8.y.normalized;
        sStack_1068.n[2] = sStack_fd8.y.n[2];
        sStack_1068.n[3] = sStack_fd8.y.n[3];
        uVar30 = 1;
        psVar10 = asStack_f40;
        do {
          uVar14 = (uint)(((-uVar1 ^ (uint)uStack_1118) & 0xf) == uVar30);
          secp256k1_fe_cmov((secp256k1_fe *)psVar16,psVar10 + -1,uVar14);
          secp256k1_fe_cmov(&sStack_1068,psVar10,uVar14);
          uVar30 = uVar30 + 1;
          psVar10 = (secp256k1_fe *)(psVar10[2].n + 1);
        } while (uVar30 != 0x10);
        uStack_1038 = 0;
        secp256k1_fe_verify(&sStack_1068);
        secp256k1_fe_verify_magnitude(&sStack_1068,1);
        auStack_10e8._32_8_ = 0x3ffffbfffff0bc - sStack_1068.n[0];
        auStack_10e8._40_8_ = 0x3ffffffffffffc - sStack_1068.n[1];
        auStack_10e8._48_8_ = 0x3ffffffffffffc - sStack_1068.n[2];
        auStack_10e8._56_8_ = 0x3ffffffffffffc - sStack_1068.n[3];
        auStack_10e8._64_8_ = 0x3fffffffffffc - sStack_1068.n[4];
        auStack_10e8._72_8_ = 2;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_10e8 + 0x20));
        secp256k1_fe_cmov(&sStack_1068,(secp256k1_fe *)(auStack_10e8 + 0x20),uVar1);
        secp256k1_gej_add_ge(r,r,psVar16);
        bVar33 = iVar2 != 0;
        iVar2 = iVar2 + -1;
      } while (bVar33);
      secp256k1_fe_mul(&r->z,&r->z,&sStack_1028);
      return;
    }
  }
  secp256k1_ecmult_const_cold_1();
LAB_0014944b:
  secp256k1_ecmult_const_cold_2();
  secp256k1_ge_verify(psVar16);
  psVar19 = a_02;
  for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
    (psVar19->x).n[0] = (psVar16->x).n[0];
    psVar16 = (secp256k1_ge *)((long)psVar16 + (ulong)bVar5 * -0x10 + 8);
    psVar19 = (secp256k1_ge *)((long)psVar19 + (ulong)bVar5 * -0x10 + 8);
  }
  secp256k1_fe_mul(&a_02->x,&a_02->x,&secp256k1_const_beta);
  secp256k1_ge_verify(a_02);
  return;
}

Assistant:

static void secp256k1_ellswift_prng(unsigned char* out32, const secp256k1_sha256 *hasher, uint32_t cnt) {
    secp256k1_sha256 hash = *hasher;
    unsigned char buf4[4];
#ifdef VERIFY
    size_t blocks = hash.bytes >> 6;
#endif
    buf4[0] = cnt;
    buf4[1] = cnt >> 8;
    buf4[2] = cnt >> 16;
    buf4[3] = cnt >> 24;
    secp256k1_sha256_write(&hash, buf4, 4);
    secp256k1_sha256_finalize(&hash, out32);

    /* Writing and finalizing together should trigger exactly one SHA256 compression. */
    VERIFY_CHECK(((hash.bytes) >> 6) == (blocks + 1));
}